

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_sort.cpp
# Opt level: O0

LOs __thiscall Omega_h::sort_by_keys<int>(Omega_h *this,Read<int> *keys,Int width)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar1;
  LOs LVar2;
  Read<int> local_70;
  Read<int> local_60;
  Read<int> local_50 [2];
  Read<int> local_30;
  Int local_1c;
  Read<int> *pRStack_18;
  Int width_local;
  Read<int> *keys_local;
  
  local_1c = width;
  pRStack_18 = keys;
  keys_local = (Read<int> *)this;
  if (width == 1) {
    Read<int>::Read(&local_30,keys);
    sort_by_keys_tmpl<1,int>(this,&local_30);
    Read<int>::~Read(&local_30);
    pvVar1 = extraout_RDX;
  }
  else if (width == 2) {
    Read<int>::Read(local_50,keys);
    sort_by_keys_tmpl<2,int>(this,local_50);
    Read<int>::~Read(local_50);
    pvVar1 = extraout_RDX_00;
  }
  else if (width == 3) {
    Read<int>::Read(&local_60,keys);
    sort_by_keys_tmpl<3,int>(this,&local_60);
    Read<int>::~Read(&local_60);
    pvVar1 = extraout_RDX_01;
  }
  else {
    if (width != 4) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_sort.cpp"
           ,0x5b);
    }
    Read<int>::Read(&local_70,keys);
    sort_by_keys_tmpl<4,int>(this,&local_70);
    Read<int>::~Read(&local_70);
    pvVar1 = extraout_RDX_02;
  }
  LVar2.write_.shared_alloc_.direct_ptr = pvVar1;
  LVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar2.write_.shared_alloc_;
}

Assistant:

LOs sort_by_keys(Read<T> keys, Int width) {
  if (width == 1) return sort_by_keys_tmpl<1>(keys);
  if (width == 2) return sort_by_keys_tmpl<2>(keys);
  if (width == 3) return sort_by_keys_tmpl<3>(keys);
  if (width == 4) return sort_by_keys_tmpl<4>(keys);
  OMEGA_H_NORETURN(LOs());
}